

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

LabelInstr * __thiscall
BasicBlock::CanProveConditionalBranch
          (BasicBlock *this,BranchInstr *branch,GlobOpt *globOpt,GlobHashTable *localSymToValueMap)

{
  Opnd *opnd;
  bool bVar1;
  Value *val;
  Var src1Var;
  Value *val_00;
  Var src2Var;
  Instr *this_00;
  LabelInstr *pLVar2;
  bool local_31 [8];
  bool provenTrue;
  
  val = GetValueForConditionalBranch
                  (this,branch,(branch->super_Instr).m_src1,globOpt,localSymToValueMap);
  if (val != (Value *)0x0) {
    src1Var = GlobOpt::GetConstantVar(globOpt,(branch->super_Instr).m_src1,val);
    opnd = (branch->super_Instr).m_src2;
    if (opnd == (Opnd *)0x0) {
      val_00 = (Value *)0x0;
      src2Var = (Var)0x0;
    }
    else {
      val_00 = GetValueForConditionalBranch(this,branch,opnd,globOpt,localSymToValueMap);
      if (val_00 == (Value *)0x0) {
        return (LabelInstr *)0x0;
      }
      src2Var = GlobOpt::GetConstantVar(globOpt,(branch->super_Instr).m_src2,val_00);
    }
    bVar1 = GlobOpt::CanProveConditionalBranch
                      (globOpt,&branch->super_Instr,val,val_00,src1Var,src2Var,local_31);
    if (bVar1) {
      if (local_31[0] != true) {
        this_00 = IR::Instr::GetNextRealInstrOrLabel(&branch->super_Instr);
        pLVar2 = IR::Instr::AsLabelInstr(this_00);
        return pLVar2;
      }
      return branch->m_branchTarget;
    }
  }
  return (LabelInstr *)0x0;
}

Assistant:

IR::LabelInstr* BasicBlock::CanProveConditionalBranch(IR::BranchInstr *branch, GlobOpt *globOpt, GlobHashTable *localSymToValueMap)
{
    Value *src1Val = nullptr, *src2Val = nullptr;
    Js::Var src1Var = nullptr, src2Var = nullptr;

    src1Val = GetValueForConditionalBranch(branch, branch->GetSrc1(), globOpt, localSymToValueMap);
    if (!src1Val)
    {
        return nullptr;
    }
    src1Var = globOpt->GetConstantVar(branch->GetSrc1(), src1Val);

    if (branch->GetSrc2() != nullptr)
    {
        src2Val = GetValueForConditionalBranch(branch, branch->GetSrc2(), globOpt, localSymToValueMap);
        if (!src2Val)
        {
            return nullptr;
        }
        src2Var = globOpt->GetConstantVar(branch->GetSrc2(), src2Val);
    }

    bool provenTrue;
    if (!globOpt->CanProveConditionalBranch(branch, src1Val, src2Val, src1Var, src2Var, &provenTrue))
    {
        return nullptr;
    }

    IR::LabelInstr * newTarget = provenTrue ? branch->GetTarget() : branch->GetNextRealInstrOrLabel()->AsLabelInstr();

    return newTarget;
}